

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

Symbol * __thiscall
slang::ast::anon_unknown_0::AnsiPortListBuilder::add
          (AnsiPortListBuilder *this,DeclaratorSyntax *decl,DefinitionSymbol *iface,
          string_view modport,bool isGeneric,
          span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> attrs)

{
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax;
  __extent_storage<18446744073709551615UL> _Var1;
  InterfacePortSymbol *this_00;
  size_t in_RCX;
  DefinitionSymbol *in_RDX;
  SyntaxNode *in_RSI;
  long in_RDI;
  char *in_R8;
  byte in_R9B;
  string_view sVar2;
  InterfacePortSymbol *port;
  undefined1 in_stack_000000b0 [16];
  DiagCode in_stack_000000c4;
  Token *this_01;
  undefined1 in_stack_ffffffffffffff88 [16];
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  SyntaxNode *this_02;
  
  this_01 = (Token *)&stack0x00000008;
  sVar2 = parsing::Token::valueText(this_01);
  this_02 = (SyntaxNode *)sVar2._M_str;
  _Var1._M_extent_value = (size_t)parsing::Token::location((Token *)(in_RSI + 1));
  this_00 = BumpAllocator::
            emplace<slang::ast::InterfacePortSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                      (in_stack_ffffffffffffff88._8_8_,in_stack_ffffffffffffff88._0_8_,
                       (SourceLocation *)this_01);
  this_00->interfaceDef = in_RDX;
  (this_00->modport)._M_len = in_RCX;
  (this_00->modport)._M_str = in_R8;
  this_00->isGeneric = (bool)(in_R9B & 1);
  Symbol::setSyntax(&this_00->super_Symbol,in_RSI);
  syntax._M_extent._M_extent_value = _Var1._M_extent_value;
  syntax._M_ptr = (pointer)this_01->info;
  Symbol::setAttributes
            (*(Symbol **)this_01,
             (Scope *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),syntax);
  if (*(long *)(in_RSI + 4) != 0) {
    slang::syntax::SyntaxNode::sourceRange(this_02);
    Scope::addDiag((Scope *)attrs._M_extent._M_extent_value,in_stack_000000c4,
                   (SourceRange)in_stack_000000b0);
  }
  *(undefined4 *)(in_RDI + 0x18) = 2;
  *(undefined8 *)(in_RDI + 0x20) = 0;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  *(DefinitionSymbol **)(in_RDI + 0x30) = in_RDX;
  *(size_t *)(in_RDI + 0x38) = in_RCX;
  *(char **)(in_RDI + 0x40) = in_R8;
  *(byte *)(in_RDI + 0x48) = in_R9B & 1;
  return &this_00->super_Symbol;
}

Assistant:

Symbol* add(const DeclaratorSyntax& decl, const DefinitionSymbol* iface,
                std::string_view modport, bool isGeneric,
                std::span<const AttributeInstanceSyntax* const> attrs) {
        auto port = comp.emplace<InterfacePortSymbol>(decl.name.valueText(), decl.name.location());
        port->interfaceDef = iface;
        port->modport = modport;
        port->isGeneric = isGeneric;
        port->setSyntax(decl);
        port->setAttributes(scope, attrs);

        if (decl.initializer)
            scope.addDiag(diag::AnsiIfacePortDefault, decl.initializer->sourceRange());

        lastDirection = ArgumentDirection::InOut;
        lastType = nullptr;
        lastNetType = nullptr;
        lastInterface = iface;
        lastModport = modport;
        lastGenericIface = isGeneric;

        return port;
    }